

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropymode.c
# Opt level: O1

void av1_setup_frame_contexts(AV1_COMMON *cm)

{
  BufferPool *pBVar1;
  RefCntBuffer *pRVar2;
  long lVar3;
  ulong uVar4;
  
  memcpy(cm->default_frame_context,cm->fc,0x52fc);
  if ((cm->tiles).large_scale != 0) {
    lVar3 = 0;
    do {
      if ((long)cm->remapped_ref_idx[lVar3] == -1) {
        pRVar2 = (RefCntBuffer *)0x0;
      }
      else {
        pRVar2 = cm->ref_frame_map[cm->remapped_ref_idx[lVar3]];
      }
      if (pRVar2 != (RefCntBuffer *)0x0) {
        memcpy(&pRVar2->frame_context,cm->fc,0x52fc);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 7);
    pBVar1 = cm->buffer_pool;
    if (pBVar1->num_frame_bufs != '\0') {
      lVar3 = 0x5d8;
      uVar4 = 0;
      do {
        memcpy((void *)((long)pBVar1->frame_bufs->ref_order_hints + lVar3 + -8),cm->fc,0x52fc);
        uVar4 = uVar4 + 1;
        pBVar1 = cm->buffer_pool;
        lVar3 = lVar3 + 0x58e0;
      } while (uVar4 < pBVar1->num_frame_bufs);
    }
  }
  return;
}

Assistant:

void av1_setup_frame_contexts(AV1_COMMON *cm) {
  // Store the frame context into a special slot (not associated with any
  // reference buffer), so that we can set up cm->pre_fc correctly later
  // This function must ONLY be called when cm->fc has been initialized with
  // default probs, either by av1_setup_past_independence or after manually
  // initializing them
  *cm->default_frame_context = *cm->fc;
  // TODO(jack.haughton@argondesign.com): don't think this should be necessary,
  // but could do with fuller testing
  if (cm->tiles.large_scale) {
    for (int i = LAST_FRAME; i <= ALTREF_FRAME; ++i) {
      RefCntBuffer *const buf = get_ref_frame_buf(cm, i);
      if (buf != NULL) buf->frame_context = *cm->fc;
    }
    for (int i = 0; i < cm->buffer_pool->num_frame_bufs; ++i)
      cm->buffer_pool->frame_bufs[i].frame_context = *cm->fc;
  }
}